

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_reader<wchar_t,jsoncons::string_source<wchar_t>,std::allocator<char>>::
basic_json_reader<std::__cxx11::wstring_const&>
          (basic_json_reader<wchar_t,_jsoncons::string_source<wchar_t>,_std::allocator<char>_> *this
          ,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *source,
          basic_json_visitor<wchar_t> *visitor,basic_json_decode_options<wchar_t> *options,
          function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *temp_alloc)

{
  value_type_conflict2 *in_RDX;
  json_source_adaptor<jsoncons::string_source<wchar_t>_> *in_RDI;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_R8;
  allocator<char> *in_stack_000000c8;
  function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *in_stack_000000d0;
  basic_json_decode_options<wchar_t> *in_stack_000000d8;
  basic_json_parser<wchar_t,_std::allocator<char>_> *in_stack_000000e0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff78;
  
  json_source_adaptor<jsoncons::string_source<wchar_t>>::
  json_source_adaptor<std::__cxx11::wstring_const&>(in_RDI,in_stack_ffffffffffffff78);
  basic_default_json_visitor<wchar_t>::basic_default_json_visitor
            ((basic_default_json_visitor<wchar_t> *)in_RDI);
  in_RDI[1].source_.current_ = in_RDX;
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)
             &in_RDI[1].source_.end_,in_R8);
  basic_json_parser<wchar_t,_std::allocator<char>_>::basic_json_parser
            (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)> *)0x9db64d);
  return;
}

Assistant:

basic_json_reader(Sourceable&& source,
                          basic_json_visitor<CharT>& visitor, 
                          const basic_json_decode_options<CharT>& options,
                          std::function<bool(json_errc,const ser_context&)> err_handler, 
                          const TempAllocator& temp_alloc = TempAllocator())
           : source_(std::forward<Sourceable>(source)),
             visitor_(visitor),
             parser_(options,err_handler,temp_alloc)
        {
        }